

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_advection_diffusion_reaction_splitting.c
# Opt level: O2

int jac_diffusion(sunrealtype t,N_Vector y,N_Vector fy,SUNMatrix Jac,void *user_data,N_Vector tmp1,
                 N_Vector tmp2,N_Vector tmp3)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  UserData *udata;
  long lVar5;
  double dVar6;
  
  dVar6 = *(double *)((long)user_data + 0x18) /
          (*(double *)((long)user_data + 8) * *(double *)((long)user_data + 8));
  lVar1 = *(long *)((long)Jac->content + 0x28);
  plVar2 = *(long **)((long)Jac->content + 0x40);
  *(double *)(*plVar2 + lVar1 * 8) = dVar6 * -2.0;
  lVar3 = *user_data;
  for (lVar5 = 1; lVar5 < lVar3; lVar5 = lVar5 + 1) {
    lVar4 = plVar2[lVar5];
    *(double *)(lVar4 + -8 + lVar1 * 8) = dVar6;
    *(double *)(lVar4 + lVar1 * 8) = dVar6 * -2.0;
    *(double *)(plVar2[lVar5 + -1] + 8 + lVar1 * 8) = dVar6;
  }
  return 0;
}

Assistant:

static int jac_diffusion(sunrealtype t, N_Vector y, N_Vector fy, SUNMatrix Jac,
                         void* user_data, N_Vector tmp1, N_Vector tmp2,
                         N_Vector tmp3)
{
  UserData* udata   = (UserData*)user_data;
  sunrealtype coeff = udata->b / (udata->dx * udata->dx);

  SM_ELEMENT_B(Jac, 0, 0) = -2 * coeff;
  for (int i = 1; i < udata->N; i++)
  {
    SM_ELEMENT_B(Jac, i - 1, i) = coeff;
    SM_ELEMENT_B(Jac, i, i)     = -2 * coeff;
    SM_ELEMENT_B(Jac, i, i - 1) = coeff;
  }

  return 0;
}